

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_add(_binbuf *x,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  t_atom *ptVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  
  iVar3 = x->b_n;
  iVar6 = binbuf_resize(x,iVar3 + argc);
  if (iVar6 != 0) {
    if (argc != 0) {
      ptVar4 = x->b_vec;
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&argv->a_type + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&ptVar4[iVar3].a_type + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar7 = lVar7 + 0x10;
        argc = argc + -1;
      } while (argc != 0);
    }
    return;
  }
  pd_error((void *)0x0,"binbuf_addmessage: out of space");
  return;
}

Assistant:

void binbuf_add(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_addmessage: out of space");
        return;
    }
#if 0
    startpost("binbuf_add: ");
    postatom(argc, argv);
    endpost();
#endif
    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
        *ap = *(argv++);
}